

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::AddGeneratedSource
          (cmQtAutoGenInitializer *this,ConfigString *filename,GenVarsT *genVars,bool prepend)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  uint uVar2;
  cmSourceFile *pcVar3;
  string_view local_128;
  string_view local_118;
  cmAlphaNum local_108;
  string_view local_d8;
  size_t local_c8;
  char *pcStack_c0;
  cmAlphaNum local_b0;
  string local_80;
  cmSourceFile *local_60;
  cmSourceFile *sf_1;
  string *filenameCfg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cfg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmSourceFile *sf;
  bool prepend_local;
  GenVarsT *genVars_local;
  ConfigString *filename_local;
  cmQtAutoGenInitializer *this_local;
  
  if (((this->MultiConfig & 1U) == 0) ||
     (uVar2 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x27])(), (uVar2 & 1) != 0)) {
    pcVar3 = AddGeneratedSource(this,&filename->Default,genVars,prepend);
    handleSkipPch(this,pcVar3);
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ConfigsList);
    cfg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->ConfigsList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cfg), bVar1) {
      filenameCfg = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
      sf_1 = (cmSourceFile *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&filename->Config,filenameCfg);
      local_60 = RegisterGeneratedSource(this,(string *)sf_1);
      handleSkipPch(this,local_60);
      this_00 = this->GenTarget;
      local_d8 = (string_view)::cm::operator____s("$<$<CONFIG:",0xb);
      local_c8 = local_d8._M_len;
      pcStack_c0 = local_d8._M_str;
      cmAlphaNum::cmAlphaNum(&local_b0,local_d8);
      cmAlphaNum::cmAlphaNum(&local_108,filenameCfg);
      local_118 = (string_view)::cm::operator____s(">:",2);
      pcVar3 = sf_1;
      local_128 = (string_view)::cm::operator____s(">",1);
      cmStrCat<cm::static_string_view,std::__cxx11::string,cm::static_string_view>
                (&local_80,&local_b0,&local_108,(static_string_view *)&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar3,
                 (static_string_view *)&local_128);
      cmGeneratorTarget::AddSource(this_00,&local_80,prepend);
      std::__cxx11::string::~string((string *)&local_80);
      AddToSourceGroup(this,(string *)sf_1,genVars->GenNameUpper);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddGeneratedSource(ConfigString const& filename,
                                                GenVarsT const& genVars,
                                                bool prepend)
{
  // XXX(xcode-per-cfg-src): Drop the Xcode-specific part of the condition
  // when the Xcode generator supports per-config sources.
  if (!this->MultiConfig || this->GlobalGen->IsXcode()) {
    cmSourceFile* sf =
      this->AddGeneratedSource(filename.Default, genVars, prepend);
    handleSkipPch(sf);
    return;
  }
  for (auto const& cfg : this->ConfigsList) {
    std::string const& filenameCfg = filename.Config.at(cfg);
    // Register source at makefile
    cmSourceFile* sf = this->RegisterGeneratedSource(filenameCfg);
    handleSkipPch(sf);
    // Add source file to target for this configuration.
    this->GenTarget->AddSource(
      cmStrCat("$<$<CONFIG:"_s, cfg, ">:"_s, filenameCfg, ">"_s), prepend);
    // Add source file to source group
    this->AddToSourceGroup(filenameCfg, genVars.GenNameUpper);
  }
}